

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMapTestCase.cpp
# Opt level: O1

void __thiscall SuiteFieldMapTests::TestaddGroupPtr_nullptr::RunImpl(TestaddGroupPtr_nullptr *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  FieldMap fieldMap;
  int local_a0 [2];
  message_order local_98;
  FieldMap local_78 [112];
  
  local_98.m_mode = normal;
  local_98._4_8_ = 0;
  local_98.m_groupOrder._4_8_ = 0;
  local_98._20_8_ = 0;
  FIX::FieldMap::FieldMap(local_78,&local_98);
  FIX::shared_array<int>::release(&local_98.m_groupOrder);
  FIX::FieldMap::addGroupPtr((int)local_78,(FieldMap *)0x1,false);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  local_a0[1] = 0;
  local_a0[0] = FIX::FieldMap::groupCount((int)local_78);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_98,*ppTVar2,0x43);
  UnitTest::CheckEqual<int,int>(results,local_a0 + 1,local_a0,(TestDetails *)&local_98);
  FIX::FieldMap::~FieldMap(local_78);
  return;
}

Assistant:

TEST(addGroupPtr_nullptr)
{
  FieldMap fieldMap;
  fieldMap.addGroupPtr(1, nullptr);
  CHECK_EQUAL(0, (int) fieldMap.groupCount(0));
}